

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_array.h
# Opt level: O0

void __thiscall
absl::lts_20250127::
FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::
NonEmptyInlinedStorage::AnnotateConstruct(NonEmptyInlinedStorage *this,size_type n)

{
  size_type n_local;
  NonEmptyInlinedStorage *this_local;
  
  return;
}

Assistant:

void FixedArray<T, N, A>::NonEmptyInlinedStorage::AnnotateConstruct(
    typename FixedArray<T, N, A>::size_type n) {
#ifdef ABSL_HAVE_ADDRESS_SANITIZER
  if (!n) return;
  ABSL_ANNOTATE_CONTIGUOUS_CONTAINER(data(), RedzoneEnd(), RedzoneEnd(),
                                     data() + n);
  ABSL_ANNOTATE_CONTIGUOUS_CONTAINER(RedzoneBegin(), data(), data(),
                                     RedzoneBegin());
#endif  // ABSL_HAVE_ADDRESS_SANITIZER
  static_cast<void>(n);  // Mark used when not in asan mode
}